

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint string_resize(char **out,size_t size)

{
  void *pvVar1;
  void *in_RSI;
  undefined8 *in_RDI;
  char *data;
  size_t in_stack_ffffffffffffffe8;
  
  pvVar1 = lodepng_realloc(in_RSI,in_stack_ffffffffffffffe8);
  if (pvVar1 != (void *)0x0) {
    *(undefined1 *)((long)pvVar1 + (long)in_RSI) = 0;
    *in_RDI = pvVar1;
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

static unsigned string_resize(char** out, size_t size)
{
  char* data = (char*)lodepng_realloc(*out, size + 1);
  if(data)
  {
    data[size] = 0; /*null termination char*/
    *out = data;
  }
  return data != 0;
}